

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_declared_builtin_block
          (CompilerGLSL *this,StorageClass storage,ExecutionModel model)

{
  mapped_type mVar1;
  uint uVar2;
  Decoration *pDVar3;
  uint3 uVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  BuiltIn BVar8;
  StorageClass SVar9;
  uint32_t uVar10;
  ExecutionModel EVar11;
  SPIRType *pSVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  undefined4 extraout_var;
  undefined8 uVar15;
  undefined4 extraout_var_01;
  undefined7 uVar19;
  iterator iVar16;
  SPIREntryPoint *pSVar17;
  CompilerError *pCVar18;
  char *ts_1;
  uint32_t **ppuVar20;
  SPIRVariable *pSVar21;
  char (*ts_1_00) [3];
  SPIRVariable *pSVar22;
  Decoration *pDVar23;
  ID *__k;
  char (*in_R9) [2];
  TypedID<(spirv_cross::Types)0> *pTVar24;
  SPIRVariable *pSVar25;
  allocator local_2c1;
  string local_2c0;
  uint32_t geom_stream;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  LoopLock local_290;
  SPIRVariable *local_288;
  ulong local_280;
  TypedID<(spirv_cross::Types)0> *local_278;
  SPIRType *local_270;
  SPIRVariable *local_268;
  uint32_t clip_distance_size;
  uint32_t cull_distance_size;
  SPIRVariable *local_258;
  ulong local_250;
  SPIRVariable *local_248;
  ExecutionModel local_240;
  StorageClass local_23c;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_238;
  ulong local_230;
  uint32_t *local_228;
  uint32_t *local_220;
  ParsedIR *local_218;
  TypedID<(spirv_cross::Types)0> *local_210;
  SPIRVariable *local_208;
  Bitset emitted_builtins;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  builtin_xfb_offsets;
  Bitset builtins;
  Bitset global_builtins;
  undefined4 extraout_var_00;
  
  emitted_builtins.lower = 0;
  emitted_builtins.higher._M_h._M_buckets = &emitted_builtins.higher._M_h._M_single_bucket;
  ts_1 = (char *)0x1;
  emitted_builtins.higher._M_h._M_bucket_count = 1;
  emitted_builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  emitted_builtins.higher._M_h._M_element_count = 0;
  emitted_builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  emitted_builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
  emitted_builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  global_builtins.lower = 0;
  global_builtins.higher._M_h._M_buckets = &global_builtins.higher._M_h._M_single_bucket;
  global_builtins.higher._M_h._M_bucket_count = 1;
  global_builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  global_builtins.higher._M_h._M_element_count = 0;
  local_220 = &cull_distance_size;
  cull_distance_size = 0;
  local_228 = &clip_distance_size;
  clip_distance_size = 0;
  global_builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  xfb_stride = 0;
  global_builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
  global_builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  xfb_buffer = 0;
  geom_stream = 0;
  builtin_xfb_offsets._M_h._M_buckets = &builtin_xfb_offsets._M_h._M_single_bucket;
  builtin_xfb_offsets._M_h._M_bucket_count = 1;
  builtin_xfb_offsets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  builtin_xfb_offsets._M_h._M_element_count = 0;
  builtin_xfb_offsets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  builtin_xfb_offsets._M_h._M_rehash_policy._M_next_resize = 0;
  builtin_xfb_offsets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_218 = &(this->super_Compiler).ir;
  local_240 = model;
  ParsedIR::create_loop_hard_lock(local_218);
  pTVar24 = (this->super_Compiler).ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_210 = pTVar24 + (this->super_Compiler).ir.ids_for_type[2].
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_238 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&(this->super_Compiler).ir.meta;
  local_248 = (SPIRVariable *)0x0;
  local_280 = 0;
  local_268 = (SPIRVariable *)0x0;
  local_250 = 0;
  local_230 = 0;
  local_258 = (SPIRVariable *)0x0;
  local_23c = storage;
  do {
    if (pTVar24 == local_210) {
      ParsedIR::LoopLock::~LoopLock(&local_290);
      builtins.lower = (uint64_t)((uint)global_builtins.lower & 0x1b);
      builtins.higher._M_h._M_buckets = &builtins.higher._M_h._M_single_bucket;
      builtins.higher._M_h._M_bucket_count = 1;
      builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      builtins.higher._M_h._M_element_count = 0;
      builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
      builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
      Bitset::operator=(&global_builtins,&builtins);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&builtins.higher._M_h);
      if ((local_250 & 1) == 0) {
        Bitset::operator=(&emitted_builtins,&global_builtins);
      }
      if (emitted_builtins.higher._M_h._M_element_count != 0 || emitted_builtins.lower != 0) {
        if (storage == StorageClassOutput) {
          builtins.higher._M_h._M_buckets = (__buckets_ptr)0x0;
          builtins.lower = (uint64_t)&builtins.higher._M_h._M_before_begin;
          builtins.higher._M_h._M_bucket_count = 8;
          if (((byte)local_268 & (byte)local_248 & 1) != 0) {
            if ((this->options).es != false) {
              pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c0,
                         "Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.",
                         (allocator *)&local_290);
              CompilerError::CompilerError(pCVar18,&local_2c0);
              __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            uVar2 = (this->options).version;
            if (uVar2 - 0x8c < 300) {
              ::std::__cxx11::string::string
                        ((string *)&local_2c0,"GL_ARB_enhanced_layouts",(allocator *)&local_290);
              require_extension_internal(this,&local_2c0);
              ::std::__cxx11::string::~string((string *)&local_2c0);
              if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1b8)) {
                ::std::__cxx11::string::string
                          ((string *)&local_2c0,"GL_ARB_enhanced_layouts",(allocator *)&local_290);
                require_extension_internal(this,&local_2c0);
                ::std::__cxx11::string::~string((string *)&local_2c0);
              }
            }
            else if (uVar2 < 0x8c) {
              pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c0,
                         "Component decoration is not supported in targets below GLSL 1.40.",
                         (allocator *)&local_290);
              CompilerError::CompilerError(pCVar18,&local_2c0);
              __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            ts_1 = ", xfb_stride = ";
            join<char_const(&)[14],unsigned_int&,char_const(&)[16],unsigned_int&>
                      (&local_2c0,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&xfb_buffer,
                       (uint *)", xfb_stride = ",(char (*) [16])&xfb_stride,(uint *)in_R9);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&builtins,&local_2c0);
            ::std::__cxx11::string::~string((string *)&local_2c0);
          }
          if ((local_280 & 1) != 0) {
            EVar11 = Compiler::get_execution_model(&this->super_Compiler);
            if (EVar11 != ExecutionModelGeometry) {
              pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c0,
                         "Geometry streams can only be used in geometry shaders.",
                         (allocator *)&local_290);
              CompilerError::CompilerError(pCVar18,&local_2c0);
              __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((this->options).es == true) {
              pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c0,"Multiple geometry streams not supported in ESSL.",
                         (allocator *)&local_290);
              CompilerError::CompilerError(pCVar18,&local_2c0);
              __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((this->options).version < 400) {
              ::std::__cxx11::string::string
                        ((string *)&local_2c0,"GL_ARB_transform_feedback3",(allocator *)&local_290);
              require_extension_internal(this,&local_2c0);
              ::std::__cxx11::string::~string((string *)&local_2c0);
            }
            join<char_const(&)[10],unsigned_int&>
                      (&local_2c0,(spirv_cross *)"stream = ",(char (*) [10])&geom_stream,
                       (uint *)ts_1);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&builtins,&local_2c0);
            ::std::__cxx11::string::~string((string *)&local_2c0);
          }
          if (builtins.higher._M_h._M_buckets == (__buckets_ptr)0x0) {
            statement<char_const(&)[17]>(this,(char (*) [17])0x306b28);
          }
          else {
            merge(&local_2c0,
                  (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&builtins,", ");
            statement<char_const(&)[8],std::__cxx11::string,char_const(&)[19]>
                      (this,(char (*) [8])"layout(",&local_2c0,(char (*) [19])") out gl_PerVertex");
            ::std::__cxx11::string::~string((string *)&local_2c0);
          }
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                          *)&builtins);
        }
        else {
          pSVar17 = Compiler::get_entry_point(&this->super_Compiler);
          if (pSVar17->geometry_passthrough == true) {
            statement<char_const(&)[36]>(this,(char (*) [36])"layout(passthrough) in gl_PerVertex");
          }
          else {
            statement<char_const(&)[16]>(this,(char (*) [16])0x306b4d);
          }
        }
        begin_scope(this);
        if ((emitted_builtins.lower & 1) != 0) {
          builtins.lower = builtins.lower & 0xffffffff00000000;
          iVar16 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&builtin_xfb_offsets._M_h,(key_type *)&builtins);
          if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            statement<char_const(&)[18]>(this,(char (*) [18])0x306b74);
          }
          else {
            statement<char_const(&)[21],unsigned_int&,char_const(&)[20]>
                      (this,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)iVar16.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc),(char (*) [20])") vec4 gl_Position;");
          }
        }
        if ((emitted_builtins.lower & 2) != 0) {
          builtins.lower = CONCAT44(builtins.lower._4_4_,1);
          iVar16 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&builtin_xfb_offsets._M_h,(key_type *)&builtins);
          if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            statement<char_const(&)[20]>(this,(char (*) [20])0x306b88);
          }
          else {
            statement<char_const(&)[21],unsigned_int&,char_const(&)[22]>
                      (this,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)iVar16.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc),(char (*) [22])") float gl_PointSize;");
          }
        }
        if ((emitted_builtins.lower & 8) != 0) {
          builtins.lower = CONCAT44(builtins.lower._4_4_,3);
          iVar16 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&builtin_xfb_offsets._M_h,(key_type *)&builtins);
          if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                      (this,(char (*) [23])0x306b9e,&clip_distance_size,(char (*) [3])0x30d44b);
          }
          else {
            in_R9 = (char (*) [2])0x30d44b;
            statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                      (this,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)iVar16.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc),(char (*) [25])") float gl_ClipDistance[",
                       &clip_distance_size,(char (*) [3])0x30d44b);
          }
        }
        if ((emitted_builtins.lower & 0x10) != 0) {
          builtins.lower = CONCAT44(builtins.lower._4_4_,4);
          iVar16 = ::std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&builtin_xfb_offsets._M_h,(key_type *)&builtins);
          if (iVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
                      (this,(char (*) [23])0x306bb7,&cull_distance_size,(char (*) [3])0x30d44b);
          }
          else {
            in_R9 = (char (*) [2])0x30d44b;
            statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                      (this,(char (*) [21])"layout(xfb_offset = ",
                       (uint *)((long)iVar16.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc),(char (*) [25])") float gl_CullDistance[",
                       &cull_distance_size,(char (*) [3])0x30d44b);
          }
        }
        if ((local_230 & 1) == 0) {
          end_scope_decl(this);
        }
        else {
          if (local_240 == ExecutionModelTessellationControl && storage == StorageClassOutput) {
            (*(this->super_Compiler)._vptr_Compiler[6])
                      (&local_2c0,this,(ulong)(local_258->super_IVariant).self.id,1);
            pSVar17 = Compiler::get_entry_point(&this->super_Compiler);
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&builtins,(spirv_cross *)&local_2c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31c69e
                       ,(char (*) [2])&pSVar17->output_vertices,(uint *)0x30e88f,in_R9);
            end_scope_decl(this,(string *)&builtins);
          }
          else {
            ts_1_00 = (char (*) [3])0x1;
            (*(this->super_Compiler)._vptr_Compiler[6])
                      (&local_2c0,this,(ulong)(local_258->super_IVariant).self.id);
            join<std::__cxx11::string,char_const(&)[3]>
                      ((string *)&builtins,(spirv_cross *)&local_2c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"[]",
                       ts_1_00);
            end_scope_decl(this,(string *)&builtins);
          }
          ::std::__cxx11::string::~string((string *)&builtins);
          ::std::__cxx11::string::~string((string *)&local_2c0);
        }
        statement<char_const(&)[1]>(this,(char (*) [1])0x303078);
      }
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&builtin_xfb_offsets._M_h);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&global_builtins.higher._M_h);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&emitted_builtins.higher._M_h);
      return;
    }
    ts_1 = (char *)((ulong)pTVar24->id * 0x18);
    if (*(int *)((((SPIRVariable *)ts_1)->dereference_chain).stack_storage.aligned_char +
                (long)&(this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[-2].
                       holder) == 2) {
      local_288 = ParsedIR::get<spirv_cross::SPIRVariable>(local_218,pTVar24->id);
      pSVar12 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(local_288->super_IVariant).field_0xc
                          );
      bVar5 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,DecorationBlock
                        );
      builtins.lower = 0;
      builtins.higher._M_h._M_buckets = &builtins.higher._M_h._M_single_bucket;
      builtins.higher._M_h._M_bucket_count = 1;
      builtins.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      builtins.higher._M_h._M_element_count = 0;
      builtins.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      builtins.higher._M_h._M_rehash_policy._M_next_resize = 0;
      builtins.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
      SVar9 = local_288->storage;
      ts_1 = (char *)CONCAT71((int7)((ulong)ts_1 >> 8),SVar9 != storage);
      local_278 = pTVar24;
      local_270 = pSVar12;
      if (!bVar5 || SVar9 != storage) {
LAB_00211bed:
        if ((!bVar5 && SVar9 == storage) &&
           (bVar5 = Compiler::is_builtin_variable(&this->super_Compiler,local_288), bVar5)) {
          __k = &(local_288->super_IVariant).self;
          pmVar13 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_238,__k);
          pTVar24 = local_278;
          if ((pmVar13->decoration).builtin == true) {
            Bitset::set(&global_builtins,(pmVar13->decoration).builtin_type);
            BVar8 = (pmVar13->decoration).builtin_type;
            if (BVar8 == BuiltInClipDistance) {
              uVar7 = to_array_size_literal(this,local_270);
              ppuVar20 = &local_228;
LAB_00211d74:
              ts_1 = (char *)*ppuVar20;
              *(uint32_t *)&(((SPIRVariable *)ts_1)->super_IVariant)._vptr_IVariant = uVar7;
              BVar8 = (pmVar13->decoration).builtin_type;
            }
            else if (BVar8 == BuiltInCullDistance) {
              uVar7 = to_array_size_literal(this,local_270);
              ppuVar20 = &local_220;
              goto LAB_00211d74;
            }
            if (((BVar8 < BuiltInVertexId) && (BVar8 != 2)) &&
               (ts_1 = (char *)~(pmVar13->decoration).decoration_flags.lower,
               ((ulong)ts_1 & 0x3800000000) == 0)) {
              uVar7 = (pmVar13->decoration).offset;
              local_2c0._M_dataplus._M_p._0_4_ = BVar8;
              pmVar14 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&builtin_xfb_offsets,(key_type *)&local_2c0);
              *pmVar14 = uVar7;
              uVar7 = (pmVar13->decoration).xfb_buffer;
              uVar10 = (pmVar13->decoration).xfb_stride;
              if (((ulong)local_268 & 1) != 0) {
                if (uVar7 != xfb_buffer) {
                  pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
                  ::std::__cxx11::string::string
                            ((string *)&local_2c0,"IO block member XfbBuffer mismatch.",&local_2c1);
                  CompilerError::CompilerError(pCVar18,&local_2c0);
                  __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                if (uVar10 != xfb_stride) {
                  pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
                  ::std::__cxx11::string::string
                            ((string *)&local_2c0,"IO block member XfbBuffer mismatch.",&local_2c1);
                  CompilerError::CompilerError(pCVar18,&local_2c0);
                  __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
              }
              BVar8 = (pmVar13->decoration).builtin_type;
              uVar4 = (uint3)(uVar10 >> 8);
              local_248 = (SPIRVariable *)CONCAT71((uint7)uVar4,1);
              ts_1 = (char *)(ulong)CONCAT31(uVar4,1);
              xfb_buffer = uVar7;
              xfb_stride = uVar10;
              local_268 = (SPIRVariable *)ts_1;
            }
            pTVar24 = local_278;
            if (((BVar8 < BuiltInVertexId) && (BVar8 != 2)) &&
               (((pmVar13->decoration).decoration_flags.lower & 0x20000000) != 0)) {
              uVar7 = Compiler::get_decoration(&this->super_Compiler,(ID)__k->id,DecorationStream);
              uVar15 = CONCAT44(extraout_var_01,uVar7);
              pTVar24 = local_278;
              if (((local_280 & 1) != 0) && (geom_stream != uVar7)) {
                pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&local_2c0,"IO block member Stream mismatch.",&local_2c1);
                CompilerError::CompilerError(pCVar18,&local_2c0);
                __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              goto LAB_00211e54;
            }
          }
        }
      }
      else {
        bVar6 = Compiler::is_builtin_variable(&this->super_Compiler,local_288);
        if (!bVar6) {
          SVar9 = local_288->storage;
          goto LAB_00211bed;
        }
        pmVar13 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_238,&(local_270->super_IVariant).self);
        ts_1 = (char *)((pmVar13->members).super_VectorView<spirv_cross::Meta::Decoration>.
                        buffer_size * 0x160);
        pDVar3 = (pmVar13->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        pSVar22 = (SPIRVariable *)0x0;
        pDVar23 = pDVar3;
        local_208 = (SPIRVariable *)ts_1;
        for (pSVar25 = (SPIRVariable *)0x0; storage = local_23c, pSVar21 = local_288,
            local_208 != pSVar25; pSVar25 = (SPIRVariable *)&pSVar25[1].loop_variable) {
          if (pDVar23->builtin == true) {
            Bitset::set(&builtins,
                        *(uint32_t *)((long)((long)(&pSVar25->dependees + 1) + 8) + (long)pDVar3));
            BVar8 = *(BuiltIn *)((long)((long)(&pSVar25->dependees + 1) + 8) + (long)pDVar3);
            if (BVar8 == BuiltInClipDistance) {
              pSVar12 = Compiler::get<spirv_cross::SPIRType>
                                  (&this->super_Compiler,
                                   (local_270->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[(long)pSVar22].id);
              uVar7 = to_array_size_literal(this,pSVar12);
              ppuVar20 = &local_228;
LAB_00211b40:
              ts_1 = (char *)*ppuVar20;
              *(uint32_t *)&(((SPIRVariable *)ts_1)->super_IVariant)._vptr_IVariant = uVar7;
              BVar8 = *(BuiltIn *)((long)((long)(&pSVar25->dependees + 1) + 8) + (long)pDVar3);
            }
            else {
              ts_1 = (char *)pSVar22;
              if (BVar8 == BuiltInCullDistance) {
                pSVar12 = Compiler::get<spirv_cross::SPIRType>
                                    (&this->super_Compiler,
                                     (local_270->member_types).
                                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                     ptr[(long)pSVar22].id);
                uVar7 = to_array_size_literal(this,pSVar12);
                ppuVar20 = &local_220;
                goto LAB_00211b40;
              }
            }
            if (((BVar8 < BuiltInVertexId) && (BVar8 != 2)) &&
               ((*(byte *)((long)pDVar3[-1].extended.values +
                          (long)(&(pSVar25->dependees).stack_storage + 3) + -0x34) & 8) != 0)) {
              mVar1 = *(mapped_type *)
                       ((undefined1 *)((long)(&pSVar25->dependees + 1) + 0x1c) + (long)pDVar3);
              local_2c0._M_dataplus._M_p._0_4_ = BVar8;
              pmVar14 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&builtin_xfb_offsets,(key_type *)&local_2c0);
              *pmVar14 = mVar1;
              BVar8 = *(BuiltIn *)((long)((long)(&pSVar25->dependees + 1) + 8) + (long)pDVar3);
              ts_1 = (char *)CONCAT71((int7)((ulong)ts_1 >> 8),1);
              pTVar24 = local_278;
              local_248 = (SPIRVariable *)ts_1;
            }
            if (((BVar8 < BuiltInVertexId) && (BVar8 != 2)) &&
               ((*(byte *)((long)pDVar3[-1].extended.values +
                          (long)(&(pSVar25->dependees).stack_storage + 3) + -0x35) & 0x20) != 0)) {
              uVar7 = *(uint32_t *)
                       ((long)pDVar3[-1].extended.values +
                       (long)(&pSVar25[1].dereference_chain.stack_storage + 2) + -0x30);
              if (((local_280 & 1) != 0) && (geom_stream != uVar7)) {
                pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&local_2c0,"IO block member Stream mismatch.",&local_2c1);
                CompilerError::CompilerError(pCVar18,&local_2c0);
                __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              local_280 = CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
              geom_stream = uVar7;
            }
          }
          pSVar22 = (SPIRVariable *)(ulong)((int)pSVar22 + 1);
          pDVar23 = pDVar23 + 1;
        }
        if (local_23c != StorageClassOutput) goto LAB_00211e5f;
        bVar5 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(local_288->super_IVariant).self.id,
                           DecorationXfbBuffer);
        if ((bVar5) &&
           (bVar5 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(pSVar21->super_IVariant).self.id,
                               DecorationXfbStride), bVar5)) {
          uVar7 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(pSVar21->super_IVariant).self.id,
                             DecorationXfbBuffer);
          uVar10 = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(pSVar21->super_IVariant).self.id,
                              DecorationXfbStride);
          if (((ulong)local_268 & 1) != 0) {
            if (uVar7 != xfb_buffer) {
              pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c0,"IO block member XfbBuffer mismatch.",&local_2c1);
              CompilerError::CompilerError(pCVar18,&local_2c0);
              __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if (uVar10 != xfb_stride) {
              pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_2c0,"IO block member XfbBuffer mismatch.",&local_2c1);
              CompilerError::CompilerError(pCVar18,&local_2c0);
              __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          local_268 = (SPIRVariable *)CONCAT71((int7)(CONCAT44(extraout_var,uVar10) >> 8),1);
          ts_1 = (char *)pSVar21;
          pSVar21 = local_288;
          xfb_buffer = uVar7;
          xfb_stride = uVar10;
        }
        bVar5 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(pSVar21->super_IVariant).self.id,
                           DecorationStream);
        if (!bVar5) goto LAB_00211e5f;
        uVar7 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(pSVar21->super_IVariant).self.id,
                           DecorationStream);
        uVar15 = CONCAT44(extraout_var_00,uVar7);
        if (((local_280 & 1) != 0) && (geom_stream != uVar7)) {
          pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_2c0,"IO block member Stream mismatch.",&local_2c1);
          CompilerError::CompilerError(pCVar18,&local_2c0);
          __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
LAB_00211e54:
        geom_stream = (uint32_t)uVar15;
        local_280 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
      }
LAB_00211e5f:
      if (builtins.higher._M_h._M_element_count != 0 || builtins.lower != 0) {
        if ((local_250 & 1) != 0) {
          pCVar18 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_2c0,"Cannot use more than one builtin I/O block.",&local_2c1);
          CompilerError::CompilerError(pCVar18,&local_2c0);
          __cxa_throw(pCVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        Bitset::operator=(&emitted_builtins,&builtins);
        uVar19 = (undefined7)((ulong)local_270 >> 8);
        local_230 = CONCAT71(uVar19,(local_270->array).super_VectorView<unsigned_int>.buffer_size !=
                                    0);
        local_250 = CONCAT71(uVar19,1);
        local_258 = local_288;
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&builtins.higher._M_h);
    }
    pTVar24 = pTVar24 + 1;
  } while( true );
}

Assistant:

void CompilerGLSL::emit_declared_builtin_block(StorageClass storage, ExecutionModel model)
{
	Bitset emitted_builtins;
	Bitset global_builtins;
	const SPIRVariable *block_var = nullptr;
	bool emitted_block = false;
	bool builtin_array = false;

	// Need to use declared size in the type.
	// These variables might have been declared, but not statically used, so we haven't deduced their size yet.
	uint32_t cull_distance_size = 0;
	uint32_t clip_distance_size = 0;

	bool have_xfb_buffer_stride = false;
	bool have_geom_stream = false;
	bool have_any_xfb_offset = false;
	uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;
	std::unordered_map<uint32_t, uint32_t> builtin_xfb_offsets;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		Bitset builtins;

		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t index = 0;
			for (auto &m : ir.meta[type.self].members)
			{
				if (m.builtin)
				{
					builtins.set(m.builtin_type);
					if (m.builtin_type == BuiltInCullDistance)
						cull_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));
					else if (m.builtin_type == BuiltInClipDistance)
						clip_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationOffset))
					{
						have_any_xfb_offset = true;
						builtin_xfb_offsets[m.builtin_type] = m.offset;
					}

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
					{
						uint32_t stream = m.stream;
						if (have_geom_stream && geom_stream != stream)
							SPIRV_CROSS_THROW("IO block member Stream mismatch.");
						have_geom_stream = true;
						geom_stream = stream;
					}
				}
				index++;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationXfbBuffer) &&
			    has_decoration(var.self, DecorationXfbStride))
			{
				uint32_t buffer_index = get_decoration(var.self, DecorationXfbBuffer);
				uint32_t stride = get_decoration(var.self, DecorationXfbStride);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
				xfb_stride = stride;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationStream))
			{
				uint32_t stream = get_decoration(var.self, DecorationStream);
				if (have_geom_stream && geom_stream != stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = stream;
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			// While we're at it, collect all declared global builtins (HLSL mostly ...).
			auto &m = ir.meta[var.self].decoration;
			if (m.builtin)
			{
				global_builtins.set(m.builtin_type);
				if (m.builtin_type == BuiltInCullDistance)
					cull_distance_size = to_array_size_literal(type);
				else if (m.builtin_type == BuiltInClipDistance)
					clip_distance_size = to_array_size_literal(type);

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationXfbStride) &&
				    m.decoration_flags.get(DecorationXfbBuffer) && m.decoration_flags.get(DecorationOffset))
				{
					have_any_xfb_offset = true;
					builtin_xfb_offsets[m.builtin_type] = m.offset;
					uint32_t buffer_index = m.xfb_buffer;
					uint32_t stride = m.xfb_stride;
					if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					if (have_xfb_buffer_stride && stride != xfb_stride)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					have_xfb_buffer_stride = true;
					xfb_buffer = buffer_index;
					xfb_stride = stride;
				}

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
				{
					uint32_t stream = get_decoration(var.self, DecorationStream);
					if (have_geom_stream && geom_stream != stream)
						SPIRV_CROSS_THROW("IO block member Stream mismatch.");
					have_geom_stream = true;
					geom_stream = stream;
				}
			}
		}

		if (builtins.empty())
			return;

		if (emitted_block)
			SPIRV_CROSS_THROW("Cannot use more than one builtin I/O block.");

		emitted_builtins = builtins;
		emitted_block = true;
		builtin_array = !type.array.empty();
		block_var = &var;
	});

	global_builtins =
	    Bitset(global_builtins.get_lower() & ((1ull << BuiltInPosition) | (1ull << BuiltInPointSize) |
	                                          (1ull << BuiltInClipDistance) | (1ull << BuiltInCullDistance)));

	// Try to collect all other declared builtins.
	if (!emitted_block)
		emitted_builtins = global_builtins;

	// Can't declare an empty interface block.
	if (emitted_builtins.empty())
		return;

	if (storage == StorageClassOutput)
	{
		SmallVector<string> attr;
		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			if (!options.es)
			{
				if (options.version < 440 && options.version >= 140)
					require_extension_internal("GL_ARB_enhanced_layouts");
				else if (options.version < 140)
					SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
				if (!options.es && options.version < 440)
					require_extension_internal("GL_ARB_enhanced_layouts");
			}
			else if (options.es)
				SPIRV_CROSS_THROW("Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
			attr.push_back(join("xfb_buffer = ", xfb_buffer, ", xfb_stride = ", xfb_stride));
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", geom_stream));
		}

		if (!attr.empty())
			statement("layout(", merge(attr), ") out gl_PerVertex");
		else
			statement("out gl_PerVertex");
	}
	else
	{
		// If we have passthrough, there is no way PerVertex cannot be passthrough.
		if (get_entry_point().geometry_passthrough)
			statement("layout(passthrough) in gl_PerVertex");
		else
			statement("in gl_PerVertex");
	}

	begin_scope();
	if (emitted_builtins.get(BuiltInPosition))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPosition);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") vec4 gl_Position;");
		else
			statement("vec4 gl_Position;");
	}

	if (emitted_builtins.get(BuiltInPointSize))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPointSize);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_PointSize;");
		else
			statement("float gl_PointSize;");
	}

	if (emitted_builtins.get(BuiltInClipDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInClipDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_ClipDistance[", clip_distance_size, "];");
		else
			statement("float gl_ClipDistance[", clip_distance_size, "];");
	}

	if (emitted_builtins.get(BuiltInCullDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInCullDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_CullDistance[", cull_distance_size, "];");
		else
			statement("float gl_CullDistance[", cull_distance_size, "];");
	}

	if (builtin_array)
	{
		if (model == ExecutionModelTessellationControl && storage == StorageClassOutput)
			end_scope_decl(join(to_name(block_var->self), "[", get_entry_point().output_vertices, "]"));
		else
			end_scope_decl(join(to_name(block_var->self), "[]"));
	}
	else
		end_scope_decl();
	statement("");
}